

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::setDocumentMode(QMainWindowLayout *this,bool enabled)

{
  bool bVar1;
  const_iterator o;
  QTabBar **ppQVar2;
  byte in_SIL;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  QTabBar *bar_1;
  add_const_t<QList<QTabBar_*>_> *__range1_1;
  QTabBar *bar;
  add_const_t<QSet<QTabBar_*>_> *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QTabBar *in_stack_ffffffffffffff90;
  size_t *this_00;
  const_iterator local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)&in_RDI[0x71].i.i.d & 1) != (in_SIL & 1)) {
    *(byte *)&in_RDI[0x71].i.i.d = in_SIL & 1;
    this_00 = &in_RDI[0x71].i.i.bucket;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QTabBar_*>::begin((QSet<QTabBar_*> *)this_00);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QTabBar_*>::end((QSet<QTabBar_*> *)this_00);
    while (bVar1 = QSet<QTabBar_*>::const_iterator::operator!=
                             ((const_iterator *)in_stack_ffffffffffffff90,in_RDI), bVar1) {
      QSet<QTabBar_*>::const_iterator::operator*((const_iterator *)0x5f6c33);
      QTabBar::setDocumentMode(in_stack_ffffffffffffff90,SUB81((ulong)in_RDI >> 0x38,0));
      QSet<QTabBar_*>::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff90);
    }
    local_30.i = (QTabBar **)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QTabBar_*>::begin((QList<QTabBar_*> *)in_stack_ffffffffffffff90);
    o = QList<QTabBar_*>::end((QList<QTabBar_*> *)in_stack_ffffffffffffff90);
    while (bVar1 = QList<QTabBar_*>::const_iterator::operator!=(&local_30,o), bVar1) {
      ppQVar2 = QList<QTabBar_*>::const_iterator::operator*(&local_30);
      QTabBar::setDocumentMode(*ppQVar2,SUB81((ulong)in_RDI >> 0x38,0));
      QList<QTabBar_*>::const_iterator::operator++(&local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::setDocumentMode(bool enabled)
{
    if (_documentMode == enabled)
        return;

    _documentMode = enabled;

    // Update the document mode for all tab bars
    for (QTabBar *bar : std::as_const(usedTabBars))
        bar->setDocumentMode(_documentMode);
    for (QTabBar *bar : std::as_const(unusedTabBars))
        bar->setDocumentMode(_documentMode);
}